

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O3

QString * formatBacktraceForLogMessage
                    (QString *__return_storage_ptr__,BacktraceParams *backtraceParams,
                    QMessageLogContext *ctx)

{
  char *pcVar1;
  qsizetype seplen;
  QByteArray info;
  QByteArray info_00;
  qsizetype qVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  qsizetype qVar8;
  QString *pQVar9;
  pointer pQVar10;
  undefined8 extraout_RAX;
  QString *pQVar11;
  QArrayData *data;
  char16_t *sep;
  QString *pQVar12;
  QString *pQVar13;
  QArrayData *pQVar14;
  QArrayData *pQVar15;
  char *pcVar16;
  char *oldD;
  long in_FS_OFFSET;
  QLatin1StringView needle;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QByteArrayView ba_03;
  QLatin1StringView haystack;
  QLatin1StringView haystack_00;
  QLatin1StringView haystack_01;
  QLatin1StringView haystack_02;
  QLatin1StringView haystack_03;
  QLatin1StringView haystack_04;
  QLatin1StringView needle_00;
  QLatin1StringView needle_01;
  QLatin1StringView needle_02;
  QLatin1StringView needle_03;
  QLatin1StringView needle_04;
  QArrayData *in_stack_fffffffffffffe88;
  QArrayData *in_stack_fffffffffffffe90;
  QArrayData *pQVar17;
  QString *in_stack_fffffffffffffe98;
  QString *pQVar18;
  QString *local_160;
  QByteArray local_120;
  QArrayDataPointer<QString> local_108;
  QString local_e8;
  QString QStack_d0;
  QString local_b8;
  QString local_98;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  QByteArray local_70;
  QArrayData *local_58;
  QString *pQStack_50;
  QString *local_48;
  QString *local_38;
  
  local_38 = *(QString **)(in_FS_OFFSET + 0x28);
  if ((ctx->version < 3) || (bVar3 = *(byte *)&ctx[9].category, bVar3 == 0)) {
    pQVar11 = *(QString **)(in_FS_OFFSET + 0x28);
    if (pQVar11 == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return pQVar11;
    }
  }
  else {
    data = &((backtraceParams->backtraceSeparator).d.d)->super_QArrayData;
    sep = (backtraceParams->backtraceSeparator).d.ptr;
    seplen = (backtraceParams->backtraceSeparator).d.size;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      bVar3 = *(byte *)&ctx[9].category;
    }
    if ((bVar3 & 1) == 0) {
      if (*(QString **)(in_FS_OFFSET + 0x28) == local_38) {
        formatBacktraceForLogMessage();
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,1,0x10);
          }
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,2,0x10);
          }
        }
        if (*(QString **)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(extraout_RAX);
        }
      }
    }
    else {
      pQVar11 = (QString *)(long)backtraceParams->backtraceDepth;
      pcVar16 = ctx[1].function;
      local_108.d = (Data *)0x0;
      local_108.ptr = (QString *)0x0;
      local_108.size = 0;
      pcVar6 = (char *)pQVar11;
      if ((backtraceParams->backtraceDepth != 0) && (ctx[1].file != (char *)0x0)) {
        pcVar1 = pcVar16 + (long)ctx[1].file * 8;
        local_160 = (QString *)0x0;
        pQVar18 = (QString *)0x0;
        pQVar17 = (QArrayData *)0x0;
        pQVar14 = (QArrayData *)0x0;
        do {
          QStack_d0.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QStack_d0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          QStack_d0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          uStack_80 = 0xaaaaaaaa;
          uStack_7c = 0xaaaaaaaa;
          local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          iVar5 = dladdr(*(undefined8 *)pcVar16,&local_98);
          qVar2 = local_98.d.size;
          pQVar15 = &(local_98.d.d)->super_QArrayData;
          if (iVar5 == 0) {
LAB_00213a31:
            QStack_d0.d.ptr = (char16_t *)0x0;
            QStack_d0.d.size = 0;
            local_e8.d.size = 0;
            QStack_d0.d.d = (Data *)0x0;
            local_e8.d.d = (Data *)0x0;
            local_e8.d.ptr = (char16_t *)0x0;
            in_stack_fffffffffffffe90 = pQVar17;
LAB_00213bfd:
            in_stack_fffffffffffffe98 = pQVar18;
            if ((QString *)local_108.size != (QString *)0x0) {
              local_98.d.d = (Data *)0x0;
              local_98.d.ptr = L"???";
              local_98.d.size = 3;
              QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                        ((QMovableArrayOps<QString> *)&local_108,local_108.size,&local_98);
              QList<QString>::end((QList<QString> *)&local_108);
              in_stack_fffffffffffffe98 = pQVar18;
              if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                  in_stack_fffffffffffffe98 = pQVar18;
                }
              }
            }
          }
          else {
            if ((QString *)local_98.d.size == (QString *)0x0) {
              pQVar12 = (QString *)0x0;
            }
            else {
              pQVar13 = (QString *)0xffffffffffffffff;
              do {
                pQVar12 = (QString *)((long)&(pQVar13->d).d + 1);
                pcVar6 = (char *)((long)&((DataPointer *)local_98.d.size)->d + 1) + (long)pQVar13;
                pQVar13 = pQVar12;
              } while (*pcVar6 != '\0');
            }
            pcVar6 = strrchr((char *)local_98.d.d,0x2f);
            if (pcVar6 == (char *)0x0) {
              if (pQVar15 == (QArrayData *)0x0) {
                pQVar15 = (QArrayData *)0x0;
                pQVar13 = (QString *)0x0;
              }
              else {
                pQVar13 = (QString *)0xffffffffffffffff;
                do {
                  pcVar6 = (char *)((long)&(((Data *)pQVar15)->super_QArrayData).ref_._q_value.
                                           super___atomic_base<int>._M_i + 1) + (long)pQVar13;
                  pQVar13 = (QString *)((long)&(pQVar13->d).d + 1);
                } while (*pcVar6 != '\0');
              }
            }
            else {
              pQVar15 = (QArrayData *)(pcVar6 + 1);
              pQVar13 = (QString *)0xffffffffffffffff;
              do {
                pcVar7 = pcVar6 + 2 + (long)pQVar13;
                pQVar13 = (QString *)((long)&(pQVar13->d).d + 1);
              } while (*pcVar7 != '\0');
            }
            if ((QString *)local_108.size == (QString *)0x0) {
              haystack_00.m_data = (char *)pQVar15;
              haystack_00.m_size = (qsizetype)pQVar13;
              needle_00.m_data = "Qt6Core";
              needle_00.m_size = 7;
              pcVar6 = &DAT_00000007;
              qVar8 = QtPrivate::findString(haystack_00,0,needle_00,CaseSensitive);
              if (qVar8 != -1) {
                if (pQVar12 != (QString *)0x0) {
                  haystack_01.m_data = (char *)qVar2;
                  haystack_01.m_size = (qsizetype)pQVar12;
                  needle_01.m_data = "6QDebug";
                  needle_01.m_size = 7;
                  pcVar6 = &DAT_00000007;
                  qVar8 = QtPrivate::findString(haystack_01,0,needle_01,CaseSensitive);
                  if (qVar8 == -1) {
                    haystack_02.m_data = (char *)qVar2;
                    haystack_02.m_size = (qsizetype)pQVar12;
                    needle_02.m_data = "14QMessageLogger";
                    needle_02.m_size = 0x10;
                    pcVar6 = (char *)0x10;
                    qVar8 = QtPrivate::findString(haystack_02,0,needle_02,CaseSensitive);
                    if (qVar8 == -1) {
                      haystack_03.m_data = (char *)qVar2;
                      haystack_03.m_size = (qsizetype)pQVar12;
                      needle_03.m_data = "17qt_message_output";
                      needle_03.m_size = 0x13;
                      pcVar6 = (char *)0x13;
                      qVar8 = QtPrivate::findString(haystack_03,0,needle_03,CaseSensitive);
                      if (qVar8 == -1) {
                        haystack_04.m_data = (char *)qVar2;
                        haystack_04.m_size = (qsizetype)pQVar12;
                        needle_04.m_data = "26QInternalMessageLogContext";
                        needle_04.m_size = 0x1c;
                        pcVar6 = (char *)0x1c;
                        qVar8 = QtPrivate::findString(haystack_04,0,needle_04,CaseSensitive);
                        if (qVar8 == -1) goto LAB_00213829;
                      }
                    }
                  }
                }
                goto LAB_00213a31;
              }
            }
LAB_00213829:
            local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            needle.m_data = "_Z";
            needle.m_size = 2;
            pcVar6 = "_Z";
            haystack.m_data = (char *)qVar2;
            haystack.m_size = (qsizetype)pQVar12;
            bVar4 = QtPrivate::startsWith(haystack,needle,CaseSensitive);
            if (bVar4) {
              pcVar6 = (char *)0x0;
              pcVar7 = (char *)__cxa_demangle(qVar2,0,0);
              if (pcVar7 == (char *)0x0) {
                if ((QString *)qVar2 == (QString *)0x0) {
                  pQVar12 = (QString *)0x0;
                }
                else {
                  pQVar9 = (QString *)0xffffffffffffffff;
                  do {
                    pQVar12 = (QString *)((long)&(pQVar9->d).d + 1);
                    pcVar7 = (char *)((long)&((DataPointer *)qVar2)->d + 1) + (long)pQVar9;
                    pQVar9 = pQVar12;
                  } while (*pcVar7 != '\0');
                }
                ba_01.m_data = pcVar6;
                ba_01.m_size = qVar2;
                QString::fromUtf8(&local_b8,pQVar12,ba_01);
                pcVar7 = (char *)0x0;
              }
              else {
                QByteArray::QByteArray(&local_70,pcVar7,-1);
                info.d.ptr = (char *)pQVar17;
                info.d.d = (Data *)data;
                info.d.size = (qsizetype)pQVar18;
                qCleanupFuncinfo((QByteArray *)&local_58,info);
                ba.m_data = pcVar6;
                ba.m_size = (qsizetype)pQStack_50;
                QString::fromUtf8(&local_b8,local_48,ba);
                if (local_58 != (QArrayData *)0x0) {
                  LOCK();
                  (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_58,1,0x10);
                  }
                }
                if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,1,0x10);
                  }
                }
              }
              free(pcVar7);
            }
            else {
              ba_00.m_data = pcVar6;
              ba_00.m_size = qVar2;
              QString::fromLatin1((QString *)&local_58,pQVar12,ba_00);
              local_b8.d.d = (Data *)local_58;
              local_b8.d.ptr = (char16_t *)pQStack_50;
              local_b8.d.size = (qsizetype)local_48;
            }
            pQVar12 = local_160;
            in_stack_fffffffffffffe90 = pQVar17;
            in_stack_fffffffffffffe98 = pQVar18;
            if (pQVar15 != pQVar14) {
              if (pQVar15 == (QArrayData *)0x0) {
                pQVar13 = (QString *)0x0;
              }
              ba_02.m_data = pcVar6;
              ba_02.m_size = (qsizetype)pQVar15;
              QString::fromUtf8((QString *)&local_58,pQVar13,ba_02);
              pQVar12 = local_48;
              pQVar18 = pQStack_50;
              pQVar17 = local_58;
              local_48 = local_160;
              pcVar6 = (char *)local_160;
              pQVar14 = pQVar15;
              local_58 = in_stack_fffffffffffffe90;
              pQStack_50 = in_stack_fffffffffffffe98;
              if (in_stack_fffffffffffffe90 != (QArrayData *)0x0) {
                LOCK();
                (in_stack_fffffffffffffe90->ref_)._q_value.super___atomic_base<int>._M_i =
                     (in_stack_fffffffffffffe90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((in_stack_fffffffffffffe90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(in_stack_fffffffffffffe90,2,0x10);
                  pcVar6 = (char *)local_160;
                }
              }
            }
            if (pQVar17 != (QArrayData *)0x0) {
              LOCK();
              (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            QStack_d0.d.d = local_b8.d.d;
            QStack_d0.d.ptr = local_b8.d.ptr;
            QStack_d0.d.size = local_b8.d.size;
            local_e8.d.d = (Data *)pQVar17;
            local_e8.d.ptr = (char16_t *)pQVar18;
            local_e8.d.size = (qsizetype)pQVar12;
            if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
              if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            local_160 = pQVar12;
            if ((QString *)local_e8.d.size == (QString *)0x0) goto LAB_00213bfd;
            if ((QString *)QStack_d0.d.size == (QString *)0x0) {
              local_58 = (QArrayData *)CONCAT62(local_58._2_6_,0x3f);
              pcVar6 = (char *)&local_e8;
              local_48 = (QString *)CONCAT62(local_48._2_6_,0x3f);
              pQStack_50 = (QString *)pcVar6;
              QStringBuilder<QStringBuilder<char16_t,_QString_&>,_char16_t>::convertTo<QString>
                        (&local_98,
                         (QStringBuilder<QStringBuilder<char16_t,_QString_&>,_char16_t> *)&local_58)
              ;
              QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                        ((QMovableArrayOps<QString> *)&local_108,local_108.size,&local_98);
              QList<QString>::end((QList<QString> *)&local_108);
              if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            else {
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)&local_108,local_108.size,&QStack_d0);
              QList<QString>::end((QList<QString> *)&local_108);
            }
          }
          qVar2 = local_108.size;
          if (&(QStack_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((QStack_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((QStack_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((QStack_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(QStack_d0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
            }
          }
        } while (((QString *)qVar2 != pQVar11) &&
                (pcVar16 = pcVar16 + 8, in_stack_fffffffffffffe90 = pQVar17,
                in_stack_fffffffffffffe98 = pQVar18, pcVar16 != pcVar1));
        in_stack_fffffffffffffe88 = data;
        if (pQVar17 != (QArrayData *)0x0) {
          LOCK();
          (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar17->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar17,2,0x10);
          }
        }
      }
      if ((QString *)local_108.size == (QString *)0x0) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
      }
      else {
        if ((ctx->function != (char *)0x0) &&
           (bVar4 = QString::startsWith(local_108.ptr,(QChar)0x3f,CaseSensitive), bVar4)) {
          QByteArray::QByteArray(&local_120,ctx->function,-1);
          info_00.d.ptr = (char *)in_stack_fffffffffffffe90;
          info_00.d.d = (Data *)in_stack_fffffffffffffe88;
          info_00.d.size = (qsizetype)in_stack_fffffffffffffe98;
          qCleanupFuncinfo((QByteArray *)&local_98,info_00);
          ba_03.m_data = pcVar6;
          ba_03.m_size = (qsizetype)local_98.d.ptr;
          QString::fromUtf8(&local_e8,(QString *)local_98.d.size,ba_03);
          pQVar10 = QList<QString>::data((QList<QString> *)&local_108);
          pQVar17 = &((pQVar10->d).d)->super_QArrayData;
          (pQVar10->d).d = local_e8.d.d;
          pQVar11 = (QString *)(pQVar10->d).ptr;
          (pQVar10->d).ptr = local_e8.d.ptr;
          pQVar18 = (QString *)(pQVar10->d).size;
          (pQVar10->d).size = local_e8.d.size;
          local_e8.d.d = (Data *)pQVar17;
          local_e8.d.ptr = (char16_t *)pQVar11;
          local_e8.d.size = (qsizetype)pQVar18;
          if (pQVar17 != (QArrayData *)0x0) {
            LOCK();
            (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar17->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar17,2,0x10);
            }
          }
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
        if ((QChar *)sep == (QChar *)0x0) {
          sep = &QString::_empty;
        }
        QtPrivate::QStringList_join
                  (__return_storage_ptr__,(QStringList *)&local_108,(QChar *)sep,seplen);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
      if (*(QString **)(in_FS_OFFSET + 0x28) == local_38) {
        return *(QString **)(in_FS_OFFSET + 0x28);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

static QString formatBacktraceForLogMessage(const QMessagePattern::BacktraceParams backtraceParams,
                                            const QMessageLogContext &ctx)
{
    // do we have a backtrace stored?
    if (ctx.version <= QMessageLogContext::CurrentVersion)
        return QString();

    auto &fullctx = static_cast<const QInternalMessageLogContext &>(ctx);
    if (!fullctx.backtrace.has_value())
        return QString();

    QString backtraceSeparator = backtraceParams.backtraceSeparator;
    int backtraceDepth = backtraceParams.backtraceDepth;

    QStringList frames = backtraceFramesForLogMessage(backtraceDepth, *fullctx.backtrace);
    if (frames.isEmpty())
        return QString();

    // if the first frame is unknown, replace it with the context function
    if (ctx.function && frames.at(0).startsWith(u'?'))
        frames[0] = QString::fromUtf8(qCleanupFuncinfo(ctx.function));

    return frames.join(backtraceSeparator);
}